

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O2

float __thiscall Rml::Box::GetCumulativeEdge(Box *this,BoxArea area,BoxEdge edge)

{
  code *pcVar1;
  bool bVar2;
  BoxArea BVar3;
  BoxArea BVar4;
  long lVar5;
  float fVar6;
  
  if (area == Auto) {
    bVar2 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                   ,0x59);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  BVar4 = Padding;
  if ((int)area < 2) {
    BVar4 = area;
  }
  BVar3 = ~Margin;
  if (-1 < (int)BVar4) {
    BVar3 = BVar4;
  }
  fVar6 = 0.0;
  for (lVar5 = 0; (ulong)(BVar3 + Border) << 4 != lVar5; lVar5 = lVar5 + 0x10) {
    fVar6 = fVar6 + *(float *)((long)this->area_edges[0] + lVar5 + (long)(int)edge * 4);
  }
  return fVar6;
}

Assistant:

float Box::GetCumulativeEdge(BoxArea area, BoxEdge edge) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	float size = 0;
	int max_area = Math::Min((int)area, (int)BoxArea::Padding);
	for (int i = 0; i <= max_area; i++)
		size += area_edges[i][(int)edge];

	return size;
}